

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::BufferID_const&>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,
          BufferID *args_1)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  uint uVar4;
  ushort uVar5;
  ulong uVar6;
  pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>
  *ppVar7;
  long lVar8;
  ulong uVar9;
  group_type_pointer pgVar10;
  undefined1 auVar11 [16];
  
  pgVar10 = __return_storage_ptr__->pg;
  uVar6 = (ulong)__return_storage_ptr__->n;
  ppVar7 = __return_storage_ptr__->p;
  lVar8 = 1;
  while( true ) {
    pgVar1 = arrays_->groups_ + pos0;
    pgVar2 = arrays_->groups_ + pos0;
    auVar11[0] = -(pgVar2->m[0].n == '\0');
    auVar11[1] = -(pgVar2->m[1].n == '\0');
    auVar11[2] = -(pgVar2->m[2].n == '\0');
    auVar11[3] = -(pgVar2->m[3].n == '\0');
    auVar11[4] = -(pgVar2->m[4].n == '\0');
    auVar11[5] = -(pgVar2->m[5].n == '\0');
    auVar11[6] = -(pgVar2->m[6].n == '\0');
    auVar11[7] = -(pgVar2->m[7].n == '\0');
    auVar11[8] = -(pgVar2->m[8].n == '\0');
    auVar11[9] = -(pgVar2->m[9].n == '\0');
    auVar11[10] = -(pgVar2->m[10].n == '\0');
    auVar11[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar11[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar11[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar11[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar11[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar5 = (ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe;
    if (uVar5 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar4 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar6 = (ulong)uVar4;
      ppVar3 = arrays_->elements_;
      uVar9 = (ulong)(uVar4 << 5);
      ppVar7 = (pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>
                *)((long)&ppVar3[pos0 * 0xf].first.id + uVar9);
      *(uint32_t *)((long)&ppVar3[pos0 * 0xf].first.id + uVar9) = args_1->id;
      *(undefined1 (*) [16])
       ((long)&ppVar3[pos0 * 0xf].second.
               super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar9) = (undefined1  [16])0x0;
      *(undefined8 *)
       ((long)&ppVar3[pos0 * 0xf].second.
               super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + uVar9) = 0;
      pgVar1->m[uVar6].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar10 = pgVar1;
    }
    if (uVar5 != 0) break;
    pos0 = pos0 + lVar8 & arrays_->groups_size_mask;
    lVar8 = lVar8 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar6;
  __return_storage_ptr__->p = ppVar7;
  __return_storage_ptr__->pg = pgVar10;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }